

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

int valid_nifti_brick_list(nifti_image *nim,int nbricks,int *blist,int disp_error)

{
  int local_34;
  uint local_30;
  int nsubs;
  int c;
  int disp_error_local;
  int *blist_local;
  int nbricks_local;
  nifti_image *nim_local;
  
  if (nim == (nifti_image *)0x0) {
    if ((disp_error != 0) || (0 < g_opts.debug)) {
      fprintf(_stderr,"** valid_nifti_brick_list: missing nifti image\n");
    }
    nim_local._4_4_ = 0;
  }
  else if ((nbricks < 1) || (blist == (int *)0x0)) {
    if ((disp_error != 0) || (1 < g_opts.debug)) {
      fprintf(_stderr,"** valid_nifti_brick_list: no brick list to check\n");
    }
    nim_local._4_4_ = 0;
  }
  else if (nim->dim[0] < 3) {
    if ((disp_error != 0) || (1 < g_opts.debug)) {
      fprintf(_stderr,"** cannot read explict brick list from %d-D dataset\n",
              (ulong)(uint)nim->dim[0]);
    }
    nim_local._4_4_ = 0;
  }
  else {
    local_34 = 1;
    for (local_30 = 4; (int)local_30 <= nim->dim[0]; local_30 = local_30 + 1) {
      local_34 = nim->dim[(int)local_30] * local_34;
    }
    if (local_34 < 1) {
      fprintf(_stderr,"** VNBL warning: bad dim list (%d,%d,%d,%d)\n",(ulong)(uint)nim->dim[4],
              (ulong)(uint)nim->dim[5],(ulong)(uint)nim->dim[6],(ulong)(uint)nim->dim[7]);
      nim_local._4_4_ = 0;
    }
    else {
      for (local_30 = 0; (int)local_30 < nbricks; local_30 = local_30 + 1) {
        if ((blist[(int)local_30] < 0) || (local_34 <= blist[(int)local_30])) {
          if ((disp_error != 0) || (1 < g_opts.debug)) {
            fprintf(_stderr,"** volume index %d (#%d) is out of range [0,%d]\n",
                    (ulong)(uint)blist[(int)local_30],(ulong)local_30,(ulong)(local_34 - 1));
          }
          return 0;
        }
      }
      nim_local._4_4_ = 1;
    }
  }
  return nim_local._4_4_;
}

Assistant:

int valid_nifti_brick_list(nifti_image * nim , int nbricks,
                           const int * blist, int disp_error)
{
   int c, nsubs;

   if( !nim ){
      if( disp_error || g_opts.debug > 0 )
         fprintf(stderr,"** valid_nifti_brick_list: missing nifti image\n");
      return 0;
   }

   if( nbricks <= 0 || !blist ){
      if( disp_error || g_opts.debug > 1 )
         fprintf(stderr,"** valid_nifti_brick_list: no brick list to check\n");
      return 0;
   }

   if( nim->dim[0] < 3 ){
      if( disp_error || g_opts.debug > 1 )
         fprintf(stderr,"** cannot read explict brick list from %d-D dataset\n",
                 nim->dim[0]);
      return 0;
   }

   /* nsubs sub-brick is nt*nu*nv*nw */
   for( c = 4, nsubs = 1; c <= nim->dim[0]; c++ )
      nsubs *= nim->dim[c];

   if( nsubs <= 0 ){
      fprintf(stderr,"** VNBL warning: bad dim list (%d,%d,%d,%d)\n",
                     nim->dim[4], nim->dim[5], nim->dim[6], nim->dim[7]);
      return 0;
   }

   for( c = 0; c < nbricks; c++ )
      if( (blist[c] < 0) || (blist[c] >= nsubs) ){
         if( disp_error || g_opts.debug > 1 )
            fprintf(stderr,
               "** volume index %d (#%d) is out of range [0,%d]\n",
               blist[c], c, nsubs-1);
         return 0;
      }

   return 1;  /* all is well */
}